

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputMap(Node *this,ostream *os)

{
  VariableStruct *pVVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [48];
  undefined1 local_40 [40];
  VariableStruct *ThisVar;
  ostream *os_local;
  Node *this_local;
  
  ThisVar = (VariableStruct *)os;
  os_local = (ostream *)this;
  local_40._32_8_ = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,(Node *)0x0,0);
  poVar2 = (ostream *)std::ostream::operator<<(ThisVar,std::endl<char,std::char_traits<char>>);
  Indent_abi_cxx11_((Node *)local_40);
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"// #pragma psect static_rw ");
  VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_70,(int)local_40._32_8_);
  poVar2 = std::operator<<(poVar2,(string *)local_70);
  poVar2 = std::operator<<(poVar2,",gbl,ovr");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  pVVar1 = ThisVar;
  if ((this->Tree[1]->Type == 0x1d8) && (this->Tree[1]->Block[0] == (Node *)0x0)) {
    Indent_abi_cxx11_((Node *)local_90);
    poVar2 = std::operator<<((ostream *)pVVar1,(string *)local_90);
    poVar2 = std::operator<<(poVar2,"class ");
    VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_b0,(int)local_40._32_8_);
    poVar2 = std::operator<<(poVar2,(string *)local_b0);
    poVar2 = std::operator<<(poVar2,"_C : public ");
    OutputNodeVarType_abi_cxx11_((Node *)local_d0);
    poVar2 = std::operator<<(poVar2,(string *)local_d0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_f0);
    poVar2 = std::operator<<(poVar2,(string *)local_f0);
    poVar2 = std::operator<<(poVar2,"{");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_90);
    Indent_abi_cxx11_((Node *)local_110);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_110);
    poVar2 = std::operator<<(poVar2,"} ");
    Expression_abi_cxx11_((Node *)local_130);
    poVar2 = std::operator<<(poVar2,(string *)local_130);
    poVar2 = std::operator<<(poVar2,";");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_110);
  }
  else {
    Indent_abi_cxx11_((Node *)local_150);
    poVar2 = std::operator<<((ostream *)pVVar1,(string *)local_150);
    poVar2 = std::operator<<(poVar2,"class ");
    VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_170,(int)local_40._32_8_);
    poVar2 = std::operator<<(poVar2,(string *)local_170);
    poVar2 = std::operator<<(poVar2,"_C");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_190);
    poVar2 = std::operator<<(poVar2,(string *)local_190);
    poVar2 = std::operator<<(poVar2,"{");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_1b0);
    poVar2 = std::operator<<(poVar2,(string *)local_1b0);
    poVar2 = std::operator<<(poVar2,"public:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_150);
    Level = Level + 1;
    if (this->Tree[1] != (Node *)0x0) {
      OutputDefinitionList(this->Tree[1],(ostream *)ThisVar,(Node *)0x0,0,0);
    }
    Level = Level + -1;
    Indent_abi_cxx11_((Node *)local_1d0);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_1d0);
    poVar2 = std::operator<<(poVar2,"} ");
    VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_1f0,(int)local_40._32_8_);
    poVar2 = std::operator<<(poVar2,(string *)local_1f0);
    poVar2 = std::operator<<(poVar2,";");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  return;
}

Assistant:

void Node::OutputMap(
	std::ostream& os		/**< iostream to write C++ code to */
)
{
	VariableStruct* ThisVar = Variables->Lookup(Tree[0]->TextValue, 0);

	os << std::endl << Indent() <<
		"// #pragma psect static_rw " << ThisVar->GetName(1) <<
		",gbl,ovr" << std::endl;

	//
	// We implement MAP and COMMON as classes because dealing with
	// their weirdness will be easier by creating methods in a base
	// class than putting stuff in the actual source. It should also
	// make putting everything in a common place simpler.
	//
	// Here we try to 'roll up' a MAP statement of the form
	//	MAP (my_map) my_regord my_var
	// into a shorder form than more comples MAPs. It means we can
	// rever to the values as 'my_var.value' instead of
	// 'my_map.my_var.value'.
	// Similiar code must exist in program.cc arount the prefix
	// generating code
	//
	if ((Tree[1]->Type == BAS_V_DEFINEVAR) && (Tree[1]->Block[0] == 0))
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C : public " <<
				Tree[1]->Tree[1]->OutputNodeVarType() <<
				std::endl <<
			Indent() << "{" << std::endl;

		std::cout <<
			Indent() << "} " << Tree[1]->Tree[0]->Expression() <<
				";" << std::endl <<
			std::endl;
	}
	else
	{
		os <<
			Indent() << "class " << ThisVar->GetName(1) <<
				"_C" << std::endl <<
			Indent() << "{" << std::endl <<
			Indent() << "public:" << std::endl;

		Level++;

		if (Tree[1] != 0)
		{
			Tree[1]->OutputDefinitionList(os, 0, 0);
		}

		Level--;
		std::cout <<
			Indent() << "} " << ThisVar->GetName(1) << ";" << std::endl <<
			std::endl;
	}

//	os << "// #pragma psect end " << ThisVar->GetName() << std::endl;
}